

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::format
          (BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,BasicCStringRef<char> format_str)

{
  Char *end;
  bool bVar1;
  FormatError *this_00;
  char *end_00;
  undefined1 local_68 [8];
  Arg arg;
  CStringRef local_38;
  char local_29;
  char *pcStack_28;
  Char c;
  Char *start;
  Char *s;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *this_local;
  BasicCStringRef<char> format_str_local;
  
  s = (Char *)this;
  this_local = (BasicFormatter<char,_fmt::ArgFormatter<char>_> *)format_str.data_;
  pcStack_28 = BasicCStringRef<char>::c_str((BasicCStringRef<char> *)&this_local);
  start = pcStack_28;
  while( true ) {
    while( true ) {
      do {
        end = start;
        if (*start == '\0') {
          internal::FormatterBase::write<char>
                    (&this->super_FormatterBase,this->writer_,pcStack_28,start);
          return;
        }
        end_00 = start + 1;
        local_29 = *start;
        start = end_00;
      } while ((local_29 != '{') && (local_29 != '}'));
      if (*end_00 != local_29) break;
      internal::FormatterBase::write<char>
                (&this->super_FormatterBase,this->writer_,pcStack_28,end_00);
      pcStack_28 = start + 1;
      start = pcStack_28;
    }
    if (local_29 == '}') break;
    internal::FormatterBase::write<char>(&this->super_FormatterBase,this->writer_,pcStack_28,end);
    bVar1 = internal::is_name_start<char>(*start);
    if (bVar1) {
      parse_arg_name((Arg *)local_68,this,&start);
    }
    else {
      parse_arg_index((Arg *)local_68,this,&start);
    }
    pcStack_28 = format(this,&start,(Arg *)local_68);
    start = pcStack_28;
  }
  this_00 = (FormatError *)__cxa_allocate_exception(0x10);
  BasicCStringRef<char>::BasicCStringRef(&local_38,"unmatched \'}\' in format string");
  FormatError::FormatError(this_00,local_38);
  __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

void BasicFormatter<Char, AF>::format(BasicCStringRef<Char> format_str) {
  const Char *s = format_str.c_str();
  const Char *start = s;
  while (*s) {
    Char c = *s++;
    if (c != '{' && c != '}') continue;
    if (*s == c) {
      write(writer_, start, s);
      start = ++s;
      continue;
    }
    if (c == '}')
      FMT_THROW(FormatError("unmatched '}' in format string"));
    write(writer_, start, s - 1);
    internal::Arg arg = internal::is_name_start(*s) ?
          parse_arg_name(s) : parse_arg_index(s);
    start = s = format(s, arg);
  }
  write(writer_, start, s);
}